

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

double Vec_WecMemory(Vec_Wec_t *p)

{
  int iVar1;
  long lVar2;
  Vec_Int_t *p_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vec_Wec_t *local_28;
  double Mem;
  int i;
  Vec_Wec_t *p_local;
  
  if (p == (Vec_Wec_t *)0x0) {
    p_local = (Vec_Wec_t *)0x0;
  }
  else {
    iVar1 = Vec_WecCap(p);
    lVar2 = (long)iVar1 << 4;
    auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar3._0_8_ = lVar2;
    auVar3._12_4_ = 0x45300000;
    local_28 = (Vec_Wec_t *)
               ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    for (Mem._4_4_ = 0; Mem._4_4_ < p->nSize; Mem._4_4_ = Mem._4_4_ + 1) {
      p_00 = Vec_WecEntry(p,Mem._4_4_);
      iVar1 = Vec_IntCap(p_00);
      lVar2 = (long)iVar1 << 2;
      auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar4._0_8_ = lVar2;
      auVar4._12_4_ = 0x45300000;
      local_28 = (Vec_Wec_t *)
                 ((auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) + (double)local_28)
      ;
    }
    p_local = local_28;
  }
  return (double)p_local;
}

Assistant:

static inline double Vec_WecMemory( Vec_Wec_t * p )
{
    int i;
    double Mem;
    if ( p == NULL )  return 0.0;
    Mem = sizeof(Vec_Int_t) * Vec_WecCap(p);
    for ( i = 0; i < p->nSize; i++ )
        Mem += sizeof(int) * (size_t)Vec_IntCap( Vec_WecEntry(p, i) );
    return Mem;
}